

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void notValidImpl(Parse *pParse,NameContext *pNC,char *zMsg,Expr *pExpr,Expr *pError)

{
  char *pcVar1;
  
  if (((ulong)pNC & 0x20) == 0) {
    if (((ulong)pNC & 4) == 0) {
      pcVar1 = "generated columns";
      if (((ulong)pNC & 8) == 0) {
        pcVar1 = "partial index WHERE clauses";
      }
    }
    else {
      pcVar1 = "CHECK constraints";
    }
  }
  else {
    pcVar1 = "index expressions";
  }
  sqlite3ErrorMsg(pParse,"%s prohibited in %s",zMsg,pcVar1);
  if (pExpr != (Expr *)0x0) {
    pExpr->op = 'z';
  }
  if (pError != (Expr *)0x0) {
    do {
      if (((pError->flags & 3) == 0) && (0 < (pError->w).iJoin)) {
        if ((pError->flags >> 0x1e & 1) != 0) {
          return;
        }
        pParse->db->errByteOffset = (pError->w).iJoin;
        return;
      }
      pError = pError->pLeft;
    } while (pError != (Expr *)0x0);
  }
  return;
}

Assistant:

static void notValidImpl(
   Parse *pParse,       /* Leave error message here */
   NameContext *pNC,    /* The name context */
   const char *zMsg,    /* Type of error */
   Expr *pExpr,         /* Invalidate this expression on error */
   Expr *pError         /* Associate error with this expression */
){
  const char *zIn = "partial index WHERE clauses";
  if( pNC->ncFlags & NC_IdxExpr )      zIn = "index expressions";
#ifndef SQLITE_OMIT_CHECK
  else if( pNC->ncFlags & NC_IsCheck ) zIn = "CHECK constraints";
#endif
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  else if( pNC->ncFlags & NC_GenCol ) zIn = "generated columns";
#endif
  sqlite3ErrorMsg(pParse, "%s prohibited in %s", zMsg, zIn);
  if( pExpr ) pExpr->op = TK_NULL;
  sqlite3RecordErrorOffsetOfExpr(pParse->db, pError);
}